

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack16.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_input_pack16_avx512
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  long lVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  undefined1 (*pauVar77) [64];
  undefined1 (*pauVar78) [64];
  undefined1 (*pauVar79) [64];
  undefined1 (*pauVar80) [64];
  undefined1 (*pauVar81) [64];
  undefined1 (*pauVar82) [64];
  long lVar83;
  long lVar84;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  __m512 _r0tm6;
  __m512 _r0tm5;
  __m512 _tmp56b_1;
  __m512 _tmp56a_1;
  __m512 _r0tm4;
  __m512 _r0tm3;
  __m512 _tmp34b_1;
  __m512 _tmp34a_1;
  __m512 _r0tm2;
  __m512 _r0tm1;
  __m512 _tmp12b_1;
  __m512 _tmp12a_1;
  __m512 _r0tm7;
  __m512 _r0tm0;
  __m512 _tmp07;
  __m512 _tmp06;
  __m512 _tmp05;
  __m512 _tmp04;
  __m512 _tmp03;
  __m512 _tmp02;
  __m512 _tmp01;
  __m512 _tmp00;
  int m_3;
  float *r0_tm_7;
  float *r0_tm_6;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m512 _tmp6m;
  __m512 _tmp5m;
  __m512 _tmp56b;
  __m512 _tmp56a;
  __m512 _tmp4m;
  __m512 _tmp3m;
  __m512 _tmp34b;
  __m512 _tmp34a;
  __m512 _tmp2m;
  __m512 _tmp1m;
  __m512 _tmp12b;
  __m512 _tmp12a;
  __m512 _tmp7m;
  __m512 _tmp0m;
  __m512 _r07;
  __m512 _r06;
  __m512 _r05;
  __m512 _r04;
  __m512 _r03;
  __m512 _r02;
  __m512 _r01;
  __m512 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  float tmp [8] [8] [16];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 local_67c0;
  undefined8 uStack_67b8;
  undefined8 uStack_67b0;
  undefined8 uStack_67a8;
  undefined8 uStack_67a0;
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 uStack_6768;
  undefined8 uStack_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 uStack_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 uStack_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 uStack_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 uStack_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 uStack_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 uStack_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 uStack_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 uStack_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 uStack_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 uStack_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 uStack_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 uStack_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  int local_4f84;
  undefined8 *local_4f80;
  undefined8 *local_4f78;
  undefined8 *local_4f70;
  undefined8 *local_4f68;
  undefined8 *local_4f60;
  undefined8 *local_4f58;
  undefined8 *local_4f50;
  undefined8 *local_4f48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  int local_4994;
  undefined1 (*local_4990) [64];
  int local_4988;
  int local_4984;
  undefined8 local_4980 [536];
  int local_38bc;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  lVar73 = in_RDI[7];
  iVar74 = (iVar1 + -2) / 6;
  iVar75 = ((int)in_RDI[6] + -2) / 6;
  iVar76 = iVar74 * iVar75;
  for (local_38bc = 0; local_38bc < (int)lVar73; local_38bc = local_38bc + 1) {
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    lVar6 = in_RDI[2];
    lVar7 = *in_RSI;
    lVar8 = in_RSI[8];
    lVar9 = in_RSI[2];
    for (local_4984 = 0; local_4984 < iVar75; local_4984 = local_4984 + 1) {
      for (local_4988 = 0; local_4988 < iVar74; local_4988 = local_4988 + 1) {
        local_4990 = (undefined1 (*) [64])
                     (lVar3 + lVar4 * local_38bc * lVar5 +
                      (long)iVar2 * (long)(local_4984 * 6) * lVar6 + (long)(local_4988 * 0x60) * 4);
        for (local_4994 = 0; local_4994 < 8; local_4994 = local_4994 + 1) {
          pauVar77 = local_4990 + 1;
          auVar67 = *pauVar77;
          auVar62 = *pauVar77;
          auVar92 = *pauVar77;
          pauVar78 = local_4990 + 2;
          auVar65 = *pauVar78;
          auVar59 = *pauVar78;
          auVar89 = *pauVar78;
          pauVar79 = local_4990 + 3;
          auVar93 = *pauVar79;
          auVar63 = *pauVar79;
          auVar58 = *pauVar79;
          pauVar80 = local_4990 + 4;
          auVar94 = *pauVar80;
          auVar61 = *pauVar80;
          auVar91 = *pauVar80;
          pauVar81 = local_4990 + 5;
          auVar68 = *pauVar81;
          auVar64 = *pauVar81;
          auVar95 = *pauVar81;
          pauVar82 = local_4990 + 6;
          auVar66 = *pauVar82;
          auVar60 = *pauVar82;
          auVar90 = *pauVar82;
          auVar85 = vbroadcastss_avx512f(ZEXT416(0x40a80000));
          auVar86 = vsubps_avx512f(*pauVar80,*pauVar78);
          auVar87 = vsubps_avx512f(*local_4990,*pauVar82);
          auVar85 = vfmadd213ps_avx512f(auVar86,auVar85,auVar87);
          auVar86 = vbroadcastss_avx512f(ZEXT416(0x40a80000));
          auVar87 = vsubps_avx512f(*pauVar79,*pauVar81);
          auVar88 = vsubps_avx512f(local_4990[7],*pauVar77);
          auVar86 = vfmadd213ps_avx512f(auVar87,auVar86,auVar88);
          lVar83 = (long)local_4994;
          local_4c00 = auVar85._0_8_;
          uStack_4bf8 = auVar85._8_8_;
          uStack_4bf0 = auVar85._16_8_;
          uStack_4be8 = auVar85._24_8_;
          uStack_4be0 = auVar85._32_8_;
          uStack_4bd8 = auVar85._40_8_;
          uStack_4bd0 = auVar85._48_8_;
          uStack_4bc8 = auVar85._56_8_;
          local_4980[lVar83 * 8] = local_4c00;
          local_4980[lVar83 * 8 + 1] = uStack_4bf8;
          local_4980[lVar83 * 8 + 2] = uStack_4bf0;
          local_4980[lVar83 * 8 + 3] = uStack_4be8;
          local_4980[lVar83 * 8 + 4] = uStack_4be0;
          local_4980[lVar83 * 8 + 5] = uStack_4bd8;
          local_4980[lVar83 * 8 + 6] = uStack_4bd0;
          local_4980[lVar83 * 8 + 7] = uStack_4bc8;
          lVar83 = (long)local_4994;
          local_4c40 = auVar86._0_8_;
          uStack_4c38 = auVar86._8_8_;
          uStack_4c30 = auVar86._16_8_;
          uStack_4c28 = auVar86._24_8_;
          uStack_4c20 = auVar86._32_8_;
          uStack_4c18 = auVar86._40_8_;
          uStack_4c10 = auVar86._48_8_;
          uStack_4c08 = auVar86._56_8_;
          local_4980[lVar83 * 8 + 0x1c0] = local_4c40;
          local_4980[lVar83 * 8 + 0x1c1] = uStack_4c38;
          local_4980[lVar83 * 8 + 0x1c2] = uStack_4c30;
          local_4980[lVar83 * 8 + 0x1c3] = uStack_4c28;
          local_4980[lVar83 * 8 + 0x1c4] = uStack_4c20;
          local_4980[lVar83 * 8 + 0x1c5] = uStack_4c18;
          local_4980[lVar83 * 8 + 0x1c6] = uStack_4c10;
          local_4980[lVar83 * 8 + 0x1c7] = uStack_4c08;
          auVar85 = vbroadcastss_avx512f(ZEXT416(0xc0880000));
          auVar89 = vaddps_avx512f(auVar89,auVar90);
          auVar89 = vfmadd213ps_avx512f(auVar91,auVar85,auVar89);
          auVar90 = vbroadcastss_avx512f(ZEXT416(0xc0880000));
          auVar91 = vaddps_avx512f(auVar92,auVar95);
          auVar90 = vfmadd213ps_avx512f(auVar58,auVar90,auVar91);
          auVar91 = vaddps_avx512f(auVar89,auVar90);
          local_5ac0 = auVar91._0_8_;
          uStack_5ab8 = auVar91._8_8_;
          uStack_5ab0 = auVar91._16_8_;
          uStack_5aa8 = auVar91._24_8_;
          uStack_5aa0 = auVar91._32_8_;
          uStack_5a98 = auVar91._40_8_;
          uStack_5a90 = auVar91._48_8_;
          uStack_5a88 = auVar91._56_8_;
          auVar89 = vsubps_avx512f(auVar89,auVar90);
          local_5b00 = auVar89._0_8_;
          uStack_5af8 = auVar89._8_8_;
          uStack_5af0 = auVar89._16_8_;
          uStack_5ae8 = auVar89._24_8_;
          uStack_5ae0 = auVar89._32_8_;
          uStack_5ad8 = auVar89._40_8_;
          uStack_5ad0 = auVar89._48_8_;
          uStack_5ac8 = auVar89._56_8_;
          lVar83 = (long)local_4994;
          local_4980[lVar83 * 8 + 0x40] = local_5ac0;
          local_4980[lVar83 * 8 + 0x41] = uStack_5ab8;
          local_4980[lVar83 * 8 + 0x42] = uStack_5ab0;
          local_4980[lVar83 * 8 + 0x43] = uStack_5aa8;
          local_4980[lVar83 * 8 + 0x44] = uStack_5aa0;
          local_4980[lVar83 * 8 + 0x45] = uStack_5a98;
          local_4980[lVar83 * 8 + 0x46] = uStack_5a90;
          local_4980[lVar83 * 8 + 0x47] = uStack_5a88;
          lVar83 = (long)local_4994;
          local_4980[lVar83 * 8 + 0x80] = local_5b00;
          local_4980[lVar83 * 8 + 0x81] = uStack_5af8;
          local_4980[lVar83 * 8 + 0x82] = uStack_5af0;
          local_4980[lVar83 * 8 + 0x83] = uStack_5ae8;
          local_4980[lVar83 * 8 + 0x84] = uStack_5ae0;
          local_4980[lVar83 * 8 + 0x85] = uStack_5ad8;
          local_4980[lVar83 * 8 + 0x86] = uStack_5ad0;
          local_4980[lVar83 * 8 + 0x87] = uStack_5ac8;
          auVar89 = vbroadcastss_avx512f(ZEXT416(0xbfa00000));
          auVar90 = vbroadcastss_avx512f(ZEXT416(0x3e800000));
          auVar90 = vfmadd213ps_avx512f(auVar59,auVar90,auVar60);
          auVar89 = vfmadd213ps_avx512f(auVar61,auVar89,auVar90);
          auVar90 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar91 = vbroadcastss_avx512f(ZEXT416(0xc0200000));
          auVar92 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
          auVar92 = vmulps_avx512f(auVar62,auVar92);
          auVar91 = vfmadd213ps_avx512f(auVar63,auVar91,auVar92);
          auVar90 = vfmadd213ps_avx512f(auVar64,auVar90,auVar91);
          auVar91 = vaddps_avx512f(auVar89,auVar90);
          local_5c80 = auVar91._0_8_;
          uStack_5c78 = auVar91._8_8_;
          uStack_5c70 = auVar91._16_8_;
          uStack_5c68 = auVar91._24_8_;
          uStack_5c60 = auVar91._32_8_;
          uStack_5c58 = auVar91._40_8_;
          uStack_5c50 = auVar91._48_8_;
          uStack_5c48 = auVar91._56_8_;
          auVar89 = vsubps_avx512f(auVar89,auVar90);
          local_5cc0 = auVar89._0_8_;
          uStack_5cb8 = auVar89._8_8_;
          uStack_5cb0 = auVar89._16_8_;
          uStack_5ca8 = auVar89._24_8_;
          uStack_5ca0 = auVar89._32_8_;
          uStack_5c98 = auVar89._40_8_;
          uStack_5c90 = auVar89._48_8_;
          uStack_5c88 = auVar89._56_8_;
          lVar83 = (long)local_4994;
          local_4980[lVar83 * 8 + 0xc0] = local_5c80;
          local_4980[lVar83 * 8 + 0xc1] = uStack_5c78;
          local_4980[lVar83 * 8 + 0xc2] = uStack_5c70;
          local_4980[lVar83 * 8 + 0xc3] = uStack_5c68;
          local_4980[lVar83 * 8 + 0xc4] = uStack_5c60;
          local_4980[lVar83 * 8 + 0xc5] = uStack_5c58;
          local_4980[lVar83 * 8 + 0xc6] = uStack_5c50;
          local_4980[lVar83 * 8 + 199] = uStack_5c48;
          lVar83 = (long)local_4994;
          local_4980[lVar83 * 8 + 0x100] = local_5cc0;
          local_4980[lVar83 * 8 + 0x101] = uStack_5cb8;
          local_4980[lVar83 * 8 + 0x102] = uStack_5cb0;
          local_4980[lVar83 * 8 + 0x103] = uStack_5ca8;
          local_4980[lVar83 * 8 + 0x104] = uStack_5ca0;
          local_4980[lVar83 * 8 + 0x105] = uStack_5c98;
          local_4980[lVar83 * 8 + 0x106] = uStack_5c90;
          local_4980[lVar83 * 8 + 0x107] = uStack_5c88;
          auVar89 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar90 = vbroadcastss_avx512f(ZEXT416(0xbfa00000));
          auVar90 = vfmadd213ps_avx512f(auVar94,auVar90,auVar65);
          auVar89 = vfmadd213ps_avx512f(auVar90,auVar89,auVar66);
          auVar90 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
          auVar91 = vbroadcastss_avx512f(ZEXT416(0xc0200000));
          auVar92 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar92 = vmulps_avx512f(auVar67,auVar92);
          auVar91 = vfmadd213ps_avx512f(auVar93,auVar91,auVar92);
          auVar90 = vfmadd213ps_avx512f(auVar68,auVar90,auVar91);
          auVar91 = vaddps_avx512f(auVar89,auVar90);
          local_5e40 = auVar91._0_8_;
          uStack_5e38 = auVar91._8_8_;
          uStack_5e30 = auVar91._16_8_;
          uStack_5e28 = auVar91._24_8_;
          uStack_5e20 = auVar91._32_8_;
          uStack_5e18 = auVar91._40_8_;
          uStack_5e10 = auVar91._48_8_;
          uStack_5e08 = auVar91._56_8_;
          auVar89 = vsubps_avx512f(auVar89,auVar90);
          local_5e80 = auVar89._0_8_;
          uStack_5e78 = auVar89._8_8_;
          uStack_5e70 = auVar89._16_8_;
          uStack_5e68 = auVar89._24_8_;
          uStack_5e60 = auVar89._32_8_;
          uStack_5e58 = auVar89._40_8_;
          uStack_5e50 = auVar89._48_8_;
          uStack_5e48 = auVar89._56_8_;
          lVar83 = (long)local_4994;
          local_4980[lVar83 * 8 + 0x140] = local_5e40;
          local_4980[lVar83 * 8 + 0x141] = uStack_5e38;
          local_4980[lVar83 * 8 + 0x142] = uStack_5e30;
          local_4980[lVar83 * 8 + 0x143] = uStack_5e28;
          local_4980[lVar83 * 8 + 0x144] = uStack_5e20;
          local_4980[lVar83 * 8 + 0x145] = uStack_5e18;
          local_4980[lVar83 * 8 + 0x146] = uStack_5e10;
          local_4980[lVar83 * 8 + 0x147] = uStack_5e08;
          lVar83 = (long)local_4994;
          local_4980[lVar83 * 8 + 0x180] = local_5e80;
          local_4980[lVar83 * 8 + 0x181] = uStack_5e78;
          local_4980[lVar83 * 8 + 0x182] = uStack_5e70;
          local_4980[lVar83 * 8 + 0x183] = uStack_5e68;
          local_4980[lVar83 * 8 + 0x184] = uStack_5e60;
          local_4980[lVar83 * 8 + 0x185] = uStack_5e58;
          local_4980[lVar83 * 8 + 0x186] = uStack_5e50;
          local_4980[lVar83 * 8 + 0x187] = uStack_5e48;
          local_4990 = (undefined1 (*) [64])(*local_4990 + (long)(iVar1 << 4) * 4);
        }
        local_4f48 = (undefined8 *)
                     (lVar7 + lVar8 * local_38bc * lVar9 +
                     (long)((local_4984 * iVar74 + local_4988) * 0x10) * 4);
        local_4f50 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x10) * 4);
        local_4f58 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x20) * 4);
        local_4f60 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x30) * 4);
        local_4f68 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x40) * 4);
        local_4f70 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x50) * 4);
        local_4f78 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x60) * 4);
        local_4f80 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x70) * 4);
        for (local_4f84 = 0; local_4f84 < 8; local_4f84 = local_4f84 + 1) {
          lVar83 = (long)local_4f84;
          lVar84 = (long)local_4f84;
          uVar10 = local_4980[lVar84 * 0x40 + 8];
          uVar11 = local_4980[lVar84 * 0x40 + 9];
          uVar12 = local_4980[lVar84 * 0x40 + 10];
          uVar13 = local_4980[lVar84 * 0x40 + 0xb];
          uVar14 = local_4980[lVar84 * 0x40 + 0xc];
          uVar15 = local_4980[lVar84 * 0x40 + 0xd];
          uVar16 = local_4980[lVar84 * 0x40 + 0xe];
          uVar17 = local_4980[lVar84 * 0x40 + 0xf];
          lVar84 = (long)local_4f84;
          uVar18 = local_4980[lVar84 * 0x40 + 0x10];
          uVar19 = local_4980[lVar84 * 0x40 + 0x11];
          uVar20 = local_4980[lVar84 * 0x40 + 0x12];
          uVar21 = local_4980[lVar84 * 0x40 + 0x13];
          uVar22 = local_4980[lVar84 * 0x40 + 0x14];
          uVar23 = local_4980[lVar84 * 0x40 + 0x15];
          uVar24 = local_4980[lVar84 * 0x40 + 0x16];
          uVar25 = local_4980[lVar84 * 0x40 + 0x17];
          lVar84 = (long)local_4f84;
          uVar26 = local_4980[lVar84 * 0x40 + 0x18];
          uVar27 = local_4980[lVar84 * 0x40 + 0x19];
          uVar28 = local_4980[lVar84 * 0x40 + 0x1a];
          uVar29 = local_4980[lVar84 * 0x40 + 0x1b];
          uVar30 = local_4980[lVar84 * 0x40 + 0x1c];
          uVar31 = local_4980[lVar84 * 0x40 + 0x1d];
          uVar32 = local_4980[lVar84 * 0x40 + 0x1e];
          uVar33 = local_4980[lVar84 * 0x40 + 0x1f];
          lVar84 = (long)local_4f84;
          uVar34 = local_4980[lVar84 * 0x40 + 0x20];
          uVar35 = local_4980[lVar84 * 0x40 + 0x21];
          uVar36 = local_4980[lVar84 * 0x40 + 0x22];
          uVar37 = local_4980[lVar84 * 0x40 + 0x23];
          uVar38 = local_4980[lVar84 * 0x40 + 0x24];
          uVar39 = local_4980[lVar84 * 0x40 + 0x25];
          uVar40 = local_4980[lVar84 * 0x40 + 0x26];
          uVar41 = local_4980[lVar84 * 0x40 + 0x27];
          lVar84 = (long)local_4f84;
          uVar42 = local_4980[lVar84 * 0x40 + 0x28];
          uVar43 = local_4980[lVar84 * 0x40 + 0x29];
          uVar44 = local_4980[lVar84 * 0x40 + 0x2a];
          uVar45 = local_4980[lVar84 * 0x40 + 0x2b];
          uVar46 = local_4980[lVar84 * 0x40 + 0x2c];
          uVar47 = local_4980[lVar84 * 0x40 + 0x2d];
          uVar48 = local_4980[lVar84 * 0x40 + 0x2e];
          uVar49 = local_4980[lVar84 * 0x40 + 0x2f];
          lVar84 = (long)local_4f84;
          uVar50 = local_4980[lVar84 * 0x40 + 0x30];
          uVar51 = local_4980[lVar84 * 0x40 + 0x31];
          uVar52 = local_4980[lVar84 * 0x40 + 0x32];
          uVar53 = local_4980[lVar84 * 0x40 + 0x33];
          uVar54 = local_4980[lVar84 * 0x40 + 0x34];
          uVar55 = local_4980[lVar84 * 0x40 + 0x35];
          uVar56 = local_4980[lVar84 * 0x40 + 0x36];
          uVar57 = local_4980[lVar84 * 0x40 + 0x37];
          lVar84 = (long)local_4f84;
          auVar89 = vbroadcastss_avx512f(ZEXT416(0x40a80000));
          auVar86._8_8_ = uVar35;
          auVar86._0_8_ = uVar34;
          auVar86._16_8_ = uVar36;
          auVar86._24_8_ = uVar37;
          auVar86._32_8_ = uVar38;
          auVar86._40_8_ = uVar39;
          auVar86._48_8_ = uVar40;
          auVar86._56_8_ = uVar41;
          auVar85._8_8_ = uVar19;
          auVar85._0_8_ = uVar18;
          auVar85._16_8_ = uVar20;
          auVar85._24_8_ = uVar21;
          auVar85._32_8_ = uVar22;
          auVar85._40_8_ = uVar23;
          auVar85._48_8_ = uVar24;
          auVar85._56_8_ = uVar25;
          auVar90 = vsubps_avx512f(auVar86,auVar85);
          auVar68._8_8_ = local_4980[lVar83 * 0x40 + 1];
          auVar68._0_8_ = local_4980[lVar83 * 0x40];
          auVar68._16_8_ = local_4980[lVar83 * 0x40 + 2];
          auVar68._24_8_ = local_4980[lVar83 * 0x40 + 3];
          auVar68._32_8_ = local_4980[lVar83 * 0x40 + 4];
          auVar68._40_8_ = local_4980[lVar83 * 0x40 + 5];
          auVar68._48_8_ = local_4980[lVar83 * 0x40 + 6];
          auVar68._56_8_ = local_4980[lVar83 * 0x40 + 7];
          auVar93._8_8_ = uVar51;
          auVar93._0_8_ = uVar50;
          auVar93._16_8_ = uVar52;
          auVar93._24_8_ = uVar53;
          auVar93._32_8_ = uVar54;
          auVar93._40_8_ = uVar55;
          auVar93._48_8_ = uVar56;
          auVar93._56_8_ = uVar57;
          auVar91 = vsubps_avx512f(auVar68,auVar93);
          auVar93 = vfmadd213ps_avx512f(auVar90,auVar89,auVar91);
          auVar89 = vbroadcastss_avx512f(ZEXT416(0x40a80000));
          auVar67._8_8_ = uVar27;
          auVar67._0_8_ = uVar26;
          auVar67._16_8_ = uVar28;
          auVar67._24_8_ = uVar29;
          auVar67._32_8_ = uVar30;
          auVar67._40_8_ = uVar31;
          auVar67._48_8_ = uVar32;
          auVar67._56_8_ = uVar33;
          auVar66._8_8_ = uVar43;
          auVar66._0_8_ = uVar42;
          auVar66._16_8_ = uVar44;
          auVar66._24_8_ = uVar45;
          auVar66._32_8_ = uVar46;
          auVar66._40_8_ = uVar47;
          auVar66._48_8_ = uVar48;
          auVar66._56_8_ = uVar49;
          auVar90 = vsubps_avx512f(auVar67,auVar66);
          auVar65._8_8_ = local_4980[lVar84 * 0x40 + 0x39];
          auVar65._0_8_ = local_4980[lVar84 * 0x40 + 0x38];
          auVar65._16_8_ = local_4980[lVar84 * 0x40 + 0x3a];
          auVar65._24_8_ = local_4980[lVar84 * 0x40 + 0x3b];
          auVar65._32_8_ = local_4980[lVar84 * 0x40 + 0x3c];
          auVar65._40_8_ = local_4980[lVar84 * 0x40 + 0x3d];
          auVar65._48_8_ = local_4980[lVar84 * 0x40 + 0x3e];
          auVar65._56_8_ = local_4980[lVar84 * 0x40 + 0x3f];
          auVar94._8_8_ = uVar11;
          auVar94._0_8_ = uVar10;
          auVar94._16_8_ = uVar12;
          auVar94._24_8_ = uVar13;
          auVar94._32_8_ = uVar14;
          auVar94._40_8_ = uVar15;
          auVar94._48_8_ = uVar16;
          auVar94._56_8_ = uVar17;
          auVar91 = vsubps_avx512f(auVar65,auVar94);
          auVar94 = vfmadd213ps_avx512f(auVar90,auVar89,auVar91);
          auVar89 = vbroadcastss_avx512f(ZEXT416(0xc0880000));
          auVar70._8_8_ = uVar19;
          auVar70._0_8_ = uVar18;
          auVar70._16_8_ = uVar20;
          auVar70._24_8_ = uVar21;
          auVar70._32_8_ = uVar22;
          auVar70._40_8_ = uVar23;
          auVar70._48_8_ = uVar24;
          auVar70._56_8_ = uVar25;
          auVar69._8_8_ = uVar51;
          auVar69._0_8_ = uVar50;
          auVar69._16_8_ = uVar52;
          auVar69._24_8_ = uVar53;
          auVar69._32_8_ = uVar54;
          auVar69._40_8_ = uVar55;
          auVar69._48_8_ = uVar56;
          auVar69._56_8_ = uVar57;
          auVar90 = vaddps_avx512f(auVar70,auVar69);
          auVar64._8_8_ = uVar35;
          auVar64._0_8_ = uVar34;
          auVar64._16_8_ = uVar36;
          auVar64._24_8_ = uVar37;
          auVar64._32_8_ = uVar38;
          auVar64._40_8_ = uVar39;
          auVar64._48_8_ = uVar40;
          auVar64._56_8_ = uVar41;
          auVar89 = vfmadd213ps_avx512f(auVar64,auVar89,auVar90);
          auVar90 = vbroadcastss_avx512f(ZEXT416(0xc0880000));
          auVar88._8_8_ = uVar11;
          auVar88._0_8_ = uVar10;
          auVar88._16_8_ = uVar12;
          auVar88._24_8_ = uVar13;
          auVar88._32_8_ = uVar14;
          auVar88._40_8_ = uVar15;
          auVar88._48_8_ = uVar16;
          auVar88._56_8_ = uVar17;
          auVar87._8_8_ = uVar43;
          auVar87._0_8_ = uVar42;
          auVar87._16_8_ = uVar44;
          auVar87._24_8_ = uVar45;
          auVar87._32_8_ = uVar46;
          auVar87._40_8_ = uVar47;
          auVar87._48_8_ = uVar48;
          auVar87._56_8_ = uVar49;
          auVar91 = vaddps_avx512f(auVar88,auVar87);
          auVar63._8_8_ = uVar27;
          auVar63._0_8_ = uVar26;
          auVar63._16_8_ = uVar28;
          auVar63._24_8_ = uVar29;
          auVar63._32_8_ = uVar30;
          auVar63._40_8_ = uVar31;
          auVar63._48_8_ = uVar32;
          auVar63._56_8_ = uVar33;
          auVar90 = vfmadd213ps_avx512f(auVar63,auVar90,auVar91);
          auVar91 = vaddps_avx512f(auVar89,auVar90);
          local_6400 = auVar91._0_8_;
          uStack_63f8 = auVar91._8_8_;
          uStack_63f0 = auVar91._16_8_;
          uStack_63e8 = auVar91._24_8_;
          uStack_63e0 = auVar91._32_8_;
          uStack_63d8 = auVar91._40_8_;
          uStack_63d0 = auVar91._48_8_;
          uStack_63c8 = auVar91._56_8_;
          auVar89 = vsubps_avx512f(auVar89,auVar90);
          local_6440 = auVar89._0_8_;
          uStack_6438 = auVar89._8_8_;
          uStack_6430 = auVar89._16_8_;
          uStack_6428 = auVar89._24_8_;
          uStack_6420 = auVar89._32_8_;
          uStack_6418 = auVar89._40_8_;
          uStack_6410 = auVar89._48_8_;
          uStack_6408 = auVar89._56_8_;
          auVar89 = vbroadcastss_avx512f(ZEXT416(0xbfa00000));
          auVar90 = vbroadcastss_avx512f(ZEXT416(0x3e800000));
          auVar62._8_8_ = uVar19;
          auVar62._0_8_ = uVar18;
          auVar62._16_8_ = uVar20;
          auVar62._24_8_ = uVar21;
          auVar62._32_8_ = uVar22;
          auVar62._40_8_ = uVar23;
          auVar62._48_8_ = uVar24;
          auVar62._56_8_ = uVar25;
          auVar61._8_8_ = uVar51;
          auVar61._0_8_ = uVar50;
          auVar61._16_8_ = uVar52;
          auVar61._24_8_ = uVar53;
          auVar61._32_8_ = uVar54;
          auVar61._40_8_ = uVar55;
          auVar61._48_8_ = uVar56;
          auVar61._56_8_ = uVar57;
          auVar90 = vfmadd213ps_avx512f(auVar62,auVar90,auVar61);
          auVar60._8_8_ = uVar35;
          auVar60._0_8_ = uVar34;
          auVar60._16_8_ = uVar36;
          auVar60._24_8_ = uVar37;
          auVar60._32_8_ = uVar38;
          auVar60._40_8_ = uVar39;
          auVar60._48_8_ = uVar40;
          auVar60._56_8_ = uVar41;
          auVar89 = vfmadd213ps_avx512f(auVar60,auVar89,auVar90);
          auVar90 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar91 = vbroadcastss_avx512f(ZEXT416(0xc0200000));
          auVar92 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
          auVar72._8_8_ = uVar11;
          auVar72._0_8_ = uVar10;
          auVar72._16_8_ = uVar12;
          auVar72._24_8_ = uVar13;
          auVar72._32_8_ = uVar14;
          auVar72._40_8_ = uVar15;
          auVar72._48_8_ = uVar16;
          auVar72._56_8_ = uVar17;
          auVar92 = vmulps_avx512f(auVar72,auVar92);
          auVar59._8_8_ = uVar27;
          auVar59._0_8_ = uVar26;
          auVar59._16_8_ = uVar28;
          auVar59._24_8_ = uVar29;
          auVar59._32_8_ = uVar30;
          auVar59._40_8_ = uVar31;
          auVar59._48_8_ = uVar32;
          auVar59._56_8_ = uVar33;
          auVar91 = vfmadd213ps_avx512f(auVar59,auVar91,auVar92);
          auVar58._8_8_ = uVar43;
          auVar58._0_8_ = uVar42;
          auVar58._16_8_ = uVar44;
          auVar58._24_8_ = uVar45;
          auVar58._32_8_ = uVar46;
          auVar58._40_8_ = uVar47;
          auVar58._48_8_ = uVar48;
          auVar58._56_8_ = uVar49;
          auVar90 = vfmadd213ps_avx512f(auVar58,auVar90,auVar91);
          auVar91 = vaddps_avx512f(auVar89,auVar90);
          local_65c0 = auVar91._0_8_;
          uStack_65b8 = auVar91._8_8_;
          uStack_65b0 = auVar91._16_8_;
          uStack_65a8 = auVar91._24_8_;
          uStack_65a0 = auVar91._32_8_;
          uStack_6598 = auVar91._40_8_;
          uStack_6590 = auVar91._48_8_;
          uStack_6588 = auVar91._56_8_;
          auVar89 = vsubps_avx512f(auVar89,auVar90);
          local_6600 = auVar89._0_8_;
          uStack_65f8 = auVar89._8_8_;
          uStack_65f0 = auVar89._16_8_;
          uStack_65e8 = auVar89._24_8_;
          uStack_65e0 = auVar89._32_8_;
          uStack_65d8 = auVar89._40_8_;
          uStack_65d0 = auVar89._48_8_;
          uStack_65c8 = auVar89._56_8_;
          auVar89 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar90 = vbroadcastss_avx512f(ZEXT416(0xbfa00000));
          auVar95._8_8_ = uVar35;
          auVar95._0_8_ = uVar34;
          auVar95._16_8_ = uVar36;
          auVar95._24_8_ = uVar37;
          auVar95._32_8_ = uVar38;
          auVar95._40_8_ = uVar39;
          auVar95._48_8_ = uVar40;
          auVar95._56_8_ = uVar41;
          auVar92._8_8_ = uVar19;
          auVar92._0_8_ = uVar18;
          auVar92._16_8_ = uVar20;
          auVar92._24_8_ = uVar21;
          auVar92._32_8_ = uVar22;
          auVar92._40_8_ = uVar23;
          auVar92._48_8_ = uVar24;
          auVar92._56_8_ = uVar25;
          auVar90 = vfmadd213ps_avx512f(auVar95,auVar90,auVar92);
          auVar91._8_8_ = uVar51;
          auVar91._0_8_ = uVar50;
          auVar91._16_8_ = uVar52;
          auVar91._24_8_ = uVar53;
          auVar91._32_8_ = uVar54;
          auVar91._40_8_ = uVar55;
          auVar91._48_8_ = uVar56;
          auVar91._56_8_ = uVar57;
          auVar91 = vfmadd213ps_avx512f(auVar90,auVar89,auVar91);
          auVar92 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
          auVar89 = vbroadcastss_avx512f(ZEXT416(0xc0200000));
          auVar90 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar71._8_8_ = uVar11;
          auVar71._0_8_ = uVar10;
          auVar71._16_8_ = uVar12;
          auVar71._24_8_ = uVar13;
          auVar71._32_8_ = uVar14;
          auVar71._40_8_ = uVar15;
          auVar71._48_8_ = uVar16;
          auVar71._56_8_ = uVar17;
          auVar95 = vmulps_avx512f(auVar71,auVar90);
          auVar90._8_8_ = uVar27;
          auVar90._0_8_ = uVar26;
          auVar90._16_8_ = uVar28;
          auVar90._24_8_ = uVar29;
          auVar90._32_8_ = uVar30;
          auVar90._40_8_ = uVar31;
          auVar90._48_8_ = uVar32;
          auVar90._56_8_ = uVar33;
          auVar90 = vfmadd213ps_avx512f(auVar90,auVar89,auVar95);
          auVar89._8_8_ = uVar43;
          auVar89._0_8_ = uVar42;
          auVar89._16_8_ = uVar44;
          auVar89._24_8_ = uVar45;
          auVar89._32_8_ = uVar46;
          auVar89._40_8_ = uVar47;
          auVar89._48_8_ = uVar48;
          auVar89._56_8_ = uVar49;
          auVar89 = vfmadd213ps_avx512f(auVar89,auVar92,auVar90);
          auVar90 = vaddps_avx512f(auVar91,auVar89);
          local_6780 = auVar90._0_8_;
          uStack_6778 = auVar90._8_8_;
          uStack_6770 = auVar90._16_8_;
          uStack_6768 = auVar90._24_8_;
          uStack_6760 = auVar90._32_8_;
          uStack_6758 = auVar90._40_8_;
          uStack_6750 = auVar90._48_8_;
          uStack_6748 = auVar90._56_8_;
          auVar89 = vsubps_avx512f(auVar91,auVar89);
          local_67c0 = auVar89._0_8_;
          uStack_67b8 = auVar89._8_8_;
          uStack_67b0 = auVar89._16_8_;
          uStack_67a8 = auVar89._24_8_;
          uStack_67a0 = auVar89._32_8_;
          uStack_6798 = auVar89._40_8_;
          uStack_6790 = auVar89._48_8_;
          uStack_6788 = auVar89._56_8_;
          local_5200 = auVar93._0_8_;
          uStack_51f8 = auVar93._8_8_;
          uStack_51f0 = auVar93._16_8_;
          uStack_51e8 = auVar93._24_8_;
          uStack_51e0 = auVar93._32_8_;
          uStack_51d8 = auVar93._40_8_;
          uStack_51d0 = auVar93._48_8_;
          uStack_51c8 = auVar93._56_8_;
          *local_4f48 = local_5200;
          local_4f48[1] = uStack_51f8;
          local_4f48[2] = uStack_51f0;
          local_4f48[3] = uStack_51e8;
          local_4f48[4] = uStack_51e0;
          local_4f48[5] = uStack_51d8;
          local_4f48[6] = uStack_51d0;
          local_4f48[7] = uStack_51c8;
          *local_4f50 = local_6400;
          local_4f50[1] = uStack_63f8;
          local_4f50[2] = uStack_63f0;
          local_4f50[3] = uStack_63e8;
          local_4f50[4] = uStack_63e0;
          local_4f50[5] = uStack_63d8;
          local_4f50[6] = uStack_63d0;
          local_4f50[7] = uStack_63c8;
          *local_4f58 = local_6440;
          local_4f58[1] = uStack_6438;
          local_4f58[2] = uStack_6430;
          local_4f58[3] = uStack_6428;
          local_4f58[4] = uStack_6420;
          local_4f58[5] = uStack_6418;
          local_4f58[6] = uStack_6410;
          local_4f58[7] = uStack_6408;
          *local_4f60 = local_65c0;
          local_4f60[1] = uStack_65b8;
          local_4f60[2] = uStack_65b0;
          local_4f60[3] = uStack_65a8;
          local_4f60[4] = uStack_65a0;
          local_4f60[5] = uStack_6598;
          local_4f60[6] = uStack_6590;
          local_4f60[7] = uStack_6588;
          *local_4f68 = local_6600;
          local_4f68[1] = uStack_65f8;
          local_4f68[2] = uStack_65f0;
          local_4f68[3] = uStack_65e8;
          local_4f68[4] = uStack_65e0;
          local_4f68[5] = uStack_65d8;
          local_4f68[6] = uStack_65d0;
          local_4f68[7] = uStack_65c8;
          *local_4f70 = local_6780;
          local_4f70[1] = uStack_6778;
          local_4f70[2] = uStack_6770;
          local_4f70[3] = uStack_6768;
          local_4f70[4] = uStack_6760;
          local_4f70[5] = uStack_6758;
          local_4f70[6] = uStack_6750;
          local_4f70[7] = uStack_6748;
          *local_4f78 = local_67c0;
          local_4f78[1] = uStack_67b8;
          local_4f78[2] = uStack_67b0;
          local_4f78[3] = uStack_67a8;
          local_4f78[4] = uStack_67a0;
          local_4f78[5] = uStack_6798;
          local_4f78[6] = uStack_6790;
          local_4f78[7] = uStack_6788;
          local_5240 = auVar94._0_8_;
          uStack_5238 = auVar94._8_8_;
          uStack_5230 = auVar94._16_8_;
          uStack_5228 = auVar94._24_8_;
          uStack_5220 = auVar94._32_8_;
          uStack_5218 = auVar94._40_8_;
          uStack_5210 = auVar94._48_8_;
          uStack_5208 = auVar94._56_8_;
          *local_4f80 = local_5240;
          local_4f80[1] = uStack_5238;
          local_4f80[2] = uStack_5230;
          local_4f80[3] = uStack_5228;
          local_4f80[4] = uStack_5220;
          local_4f80[5] = uStack_5218;
          local_4f80[6] = uStack_5210;
          local_4f80[7] = uStack_5208;
          local_4f48 = (undefined8 *)((long)local_4f48 + (long)(iVar76 * 0x80) * 4);
          local_4f50 = (undefined8 *)((long)local_4f50 + (long)(iVar76 * 0x80) * 4);
          local_4f58 = (undefined8 *)((long)local_4f58 + (long)(iVar76 * 0x80) * 4);
          local_4f60 = (undefined8 *)((long)local_4f60 + (long)(iVar76 * 0x80) * 4);
          local_4f68 = (undefined8 *)((long)local_4f68 + (long)(iVar76 * 0x80) * 4);
          local_4f70 = (undefined8 *)((long)local_4f70 + (long)(iVar76 * 0x80) * 4);
          local_4f78 = (undefined8 *)((long)local_4f78 + (long)(iVar76 * 0x80) * 4);
          local_4f80 = (undefined8 *)((long)local_4f80 + (long)(iVar76 * 0x80) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack16_avx512(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(64))
#else
        __attribute__((aligned(64)))
#endif
        float tmp[8][8][16];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 16;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _r00 = _mm512_load_ps(r0);
                    __m512 _r01 = _mm512_load_ps(r0 + 16);
                    __m512 _r02 = _mm512_load_ps(r0 + 16 * 2);
                    __m512 _r03 = _mm512_load_ps(r0 + 16 * 3);
                    __m512 _r04 = _mm512_load_ps(r0 + 16 * 4);
                    __m512 _r05 = _mm512_load_ps(r0 + 16 * 5);
                    __m512 _r06 = _mm512_load_ps(r0 + 16 * 6);
                    __m512 _r07 = _mm512_load_ps(r0 + 16 * 7);

                    __m512 _tmp0m = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_r04, _r02), _mm512_sub_ps(_r00, _r06));
                    __m512 _tmp7m = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_r03, _r05), _mm512_sub_ps(_r07, _r01));
                    _mm512_store_ps(tmp[0][m], _tmp0m);
                    _mm512_store_ps(tmp[7][m], _tmp7m);

                    __m512 _tmp12a = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _r04, _mm512_add_ps(_r02, _r06));
                    __m512 _tmp12b = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _r03, _mm512_add_ps(_r01, _r05));

                    __m512 _tmp1m = _mm512_add_ps(_tmp12a, _tmp12b);
                    __m512 _tmp2m = _mm512_sub_ps(_tmp12a, _tmp12b);
                    _mm512_store_ps(tmp[1][m], _tmp1m);
                    _mm512_store_ps(tmp[2][m], _tmp2m);

                    __m512 _tmp34a = _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _r04, _mm512_fmadd_ps(_mm512_set1_ps(0.25f), _r02, _r06));
                    __m512 _tmp34b = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _r05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _r03, _mm512_mul_ps(_r01, _mm512_set1_ps(0.5f))));

                    __m512 _tmp3m = _mm512_add_ps(_tmp34a, _tmp34b);
                    __m512 _tmp4m = _mm512_sub_ps(_tmp34a, _tmp34b);
                    _mm512_store_ps(tmp[3][m], _tmp3m);
                    _mm512_store_ps(tmp[4][m], _tmp4m);

                    __m512 _tmp56a = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _r04, _r02), _r06);
                    __m512 _tmp56b = _mm512_fmadd_ps(_mm512_set1_ps(0.5f), _r05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _r03, _mm512_mul_ps(_r01, _mm512_set1_ps(2.f))));

                    __m512 _tmp5m = _mm512_add_ps(_tmp56a, _tmp56b);
                    __m512 _tmp6m = _mm512_sub_ps(_tmp56a, _tmp56b);
                    _mm512_store_ps(tmp[5][m], _tmp5m);
                    _mm512_store_ps(tmp[6][m], _tmp6m);

                    r0 += w * 16;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 16;
                float* r0_tm_1 = r0_tm_0 + tiles * 16;
                float* r0_tm_2 = r0_tm_0 + tiles * 16 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 16 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 16 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 16 * 5;
                float* r0_tm_6 = r0_tm_0 + tiles * 16 * 6;
                float* r0_tm_7 = r0_tm_0 + tiles * 16 * 7;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _tmp00 = _mm512_load_ps(tmp[m][0]);
                    __m512 _tmp01 = _mm512_load_ps(tmp[m][1]);
                    __m512 _tmp02 = _mm512_load_ps(tmp[m][2]);
                    __m512 _tmp03 = _mm512_load_ps(tmp[m][3]);
                    __m512 _tmp04 = _mm512_load_ps(tmp[m][4]);
                    __m512 _tmp05 = _mm512_load_ps(tmp[m][5]);
                    __m512 _tmp06 = _mm512_load_ps(tmp[m][6]);
                    __m512 _tmp07 = _mm512_load_ps(tmp[m][7]);

                    __m512 _r0tm0 = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_tmp04, _tmp02), _mm512_sub_ps(_tmp00, _tmp06));
                    __m512 _r0tm7 = _mm512_fmadd_ps(_mm512_set1_ps(5.25f), _mm512_sub_ps(_tmp03, _tmp05), _mm512_sub_ps(_tmp07, _tmp01));

                    __m512 _tmp12a = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _tmp04, _mm512_add_ps(_tmp02, _tmp06));
                    __m512 _tmp12b = _mm512_fmadd_ps(_mm512_set1_ps(-4.25f), _tmp03, _mm512_add_ps(_tmp01, _tmp05));

                    __m512 _r0tm1 = _mm512_add_ps(_tmp12a, _tmp12b);
                    __m512 _r0tm2 = _mm512_sub_ps(_tmp12a, _tmp12b);

                    __m512 _tmp34a = _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _tmp04, _mm512_fmadd_ps(_mm512_set1_ps(0.25f), _tmp02, _tmp06));
                    __m512 _tmp34b = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _tmp03, _mm512_mul_ps(_tmp01, _mm512_set1_ps(0.5f))));

                    __m512 _r0tm3 = _mm512_add_ps(_tmp34a, _tmp34b);
                    __m512 _r0tm4 = _mm512_sub_ps(_tmp34a, _tmp34b);

                    __m512 _tmp56a = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _mm512_fmadd_ps(_mm512_set1_ps(-1.25f), _tmp04, _tmp02), _tmp06);
                    __m512 _tmp56b = _mm512_fmadd_ps(_mm512_set1_ps(0.5f), _tmp05, _mm512_fmadd_ps(_mm512_set1_ps(-2.5f), _tmp03, _mm512_mul_ps(_tmp01, _mm512_set1_ps(2.f))));

                    __m512 _r0tm5 = _mm512_add_ps(_tmp56a, _tmp56b);
                    __m512 _r0tm6 = _mm512_sub_ps(_tmp56a, _tmp56b);

                    _mm512_store_ps(r0_tm_0, _r0tm0);
                    _mm512_store_ps(r0_tm_1, _r0tm1);
                    _mm512_store_ps(r0_tm_2, _r0tm2);
                    _mm512_store_ps(r0_tm_3, _r0tm3);
                    _mm512_store_ps(r0_tm_4, _r0tm4);
                    _mm512_store_ps(r0_tm_5, _r0tm5);
                    _mm512_store_ps(r0_tm_6, _r0tm6);
                    _mm512_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 128;
                    r0_tm_1 += tiles * 128;
                    r0_tm_2 += tiles * 128;
                    r0_tm_3 += tiles * 128;
                    r0_tm_4 += tiles * 128;
                    r0_tm_5 += tiles * 128;
                    r0_tm_6 += tiles * 128;
                    r0_tm_7 += tiles * 128;
                }
            }
        }
    }
}